

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::
Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec>_>
::expand(Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec>_>
         *this)

{
  bool *pbVar1;
  bool *pbVar2;
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec>
  *ppVar3;
  undefined8 uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec>
  *ppVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  
  sVar10 = 8;
  if (this->_capacity != 0) {
    sVar10 = this->_capacity * 2;
  }
  uVar11 = sVar10 * 0x20;
  if (uVar11 == 0) {
    ppVar7 = (pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec>
              *)FixedSizeAllocator<8UL>::alloc
                          ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar11 < 0x41) {
    ppVar7 = (pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec>
              *)FixedSizeAllocator<64UL>::alloc
                          ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    ppVar7 = (pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec>
              *)::operator_new(uVar11,0x10);
  }
  if (this->_capacity != 0) {
    uVar11 = this->_capacity;
    if (uVar11 != 0) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        pbVar1 = &(this->_stack->first).q + lVar8;
        uVar4 = *(undefined8 *)pbVar1;
        uVar5 = ((TermList *)(pbVar1 + 8))->_content;
        pbVar1 = &(this->_stack->second).q + lVar8;
        uVar6 = ((TermList *)(pbVar1 + 8))->_content;
        pbVar2 = &(ppVar7->second).q + lVar8;
        *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
        ((TermList *)(pbVar2 + 8))->_content = uVar6;
        pbVar1 = &(ppVar7->first).q + lVar8;
        *(undefined8 *)pbVar1 = uVar4;
        ((TermList *)(pbVar1 + 8))->_content = uVar5;
        uVar9 = uVar9 + 1;
        uVar11 = this->_capacity;
        lVar8 = lVar8 + 0x20;
      } while (uVar9 < uVar11);
    }
    ppVar3 = this->_stack;
    if (ppVar3 != (pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::TermSpec>
                   *)0x0) {
      uVar11 = uVar11 * 0x20;
      if (uVar11 == 0) {
        *(undefined8 *)&ppVar3->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppVar3;
      }
      else if (uVar11 < 0x21) {
        *(undefined8 *)&ppVar3->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppVar3;
      }
      else if (uVar11 < 0x31) {
        *(undefined8 *)&ppVar3->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppVar3;
      }
      else if (uVar11 < 0x41) {
        *(undefined8 *)&ppVar3->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppVar3;
      }
      else {
        operator_delete(ppVar3,0x10);
      }
    }
  }
  this->_stack = ppVar7;
  this->_cursor = ppVar7 + this->_capacity;
  this->_end = ppVar7 + sVar10;
  this->_capacity = sVar10;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }